

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibraryCase.cpp
# Opt level: O2

string * __thiscall
deqp::sl::ShaderCase::genFragmentShader_abi_cxx11_
          (string *__return_storage_ptr__,ShaderCase *this,ValueBlock *valueBlock)

{
  GLSLVersion version;
  pointer pVVar1;
  bool bVar2;
  DataType DVar3;
  char *pcVar4;
  ostream *poVar5;
  char *pcVar6;
  char *in_R8;
  int ndx;
  long lVar7;
  long lVar8;
  string *psVar9;
  char *local_1c0;
  ostringstream shader;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&shader);
  version = this->m_targetVersion;
  if ((version < GLSL_VERSION_330) && ((0x71U >> (version & 0x1f) & 1) != 0)) {
    local_1c0 = "varying";
    bVar2 = false;
  }
  else {
    local_1c0 = "in";
    bVar2 = true;
  }
  pcVar4 = glu::getGLSLVersionDeclaration(version);
  poVar5 = std::operator<<(&shader.super_basic_ostream<char,_std::char_traits<char>_>,pcVar4);
  std::operator<<(poVar5,"\n");
  std::operator<<(&shader.super_basic_ostream<char,_std::char_traits<char>_>,
                  "precision mediump float;\n");
  std::operator<<(&shader.super_basic_ostream<char,_std::char_traits<char>_>,
                  "precision mediump int;\n");
  std::operator<<(&shader.super_basic_ostream<char,_std::char_traits<char>_>,"\n");
  if (bVar2) {
    std::operator<<(&shader.super_basic_ostream<char,_std::char_traits<char>_>,
                    "layout(location = 0) out mediump vec4 dEQP_FragColor;\n");
    std::operator<<(&shader.super_basic_ostream<char,_std::char_traits<char>_>,"\n");
  }
  genCompareFunctions(&shader,valueBlock,true);
  std::operator<<(&shader.super_basic_ostream<char,_std::char_traits<char>_>,"\n");
  lVar8 = 0x28;
  lVar7 = 0;
  while( true ) {
    pVVar1 = (valueBlock->values).
             super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)(((long)(valueBlock->values).
                     super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1) / 0x48) <= lVar7)
    break;
    DVar3 = glu::getDataTypeFloatScalars(*(DataType *)((long)&pVVar1->storageType + lVar8));
    pcVar4 = glu::getDataTypeName(DVar3);
    pcVar6 = glu::getDataTypeName(*(DataType *)((long)&pVVar1->storageType + lVar8));
    if (*(int *)((long)pVVar1 + lVar8 + -0x28) == 2) {
      DVar3 = glu::getDataTypeScalarType(*(DataType *)((long)&pVVar1->storageType + lVar8));
      if (DVar3 == TYPE_FLOAT) {
        poVar5 = std::operator<<(&shader.super_basic_ostream<char,_std::char_traits<char>_>,
                                 local_1c0);
        poVar5 = std::operator<<(poVar5," ");
        poVar5 = std::operator<<(poVar5,pcVar4);
        pcVar4 = " ";
      }
      else {
        poVar5 = std::operator<<(&shader.super_basic_ostream<char,_std::char_traits<char>_>,
                                 local_1c0);
        poVar5 = std::operator<<(poVar5," ");
        poVar5 = std::operator<<(poVar5,pcVar4);
        pcVar4 = " v_";
      }
      poVar5 = std::operator<<(poVar5,pcVar4);
      psVar9 = (string *)(lVar8 + -0x20 + (long)pVVar1);
      poVar5 = std::operator<<(poVar5,psVar9);
      std::operator<<(poVar5,";\n");
      poVar5 = std::operator<<(&shader.super_basic_ostream<char,_std::char_traits<char>_>,"uniform "
                              );
      poVar5 = std::operator<<(poVar5,pcVar6);
      poVar5 = std::operator<<(poVar5," ref_");
      poVar5 = std::operator<<(poVar5,psVar9);
      std::operator<<(poVar5,";\n");
    }
    lVar7 = lVar7 + 1;
    lVar8 = lVar8 + 0x48;
  }
  std::operator<<(&shader.super_basic_ostream<char,_std::char_traits<char>_>,"\n");
  std::operator<<(&shader.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n");
  std::operator<<(&shader.super_basic_ostream<char,_std::char_traits<char>_>,"{\n");
  std::operator<<(&shader.super_basic_ostream<char,_std::char_traits<char>_>," ");
  pcVar4 = "gl_FragColor";
  if (bVar2) {
    pcVar4 = "dEQP_FragColor";
  }
  genCompareOp(&shader,pcVar4,valueBlock,"v_",in_R8);
  std::operator<<(&shader.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&shader);
  return __return_storage_ptr__;
}

Assistant:

string ShaderCase::genFragmentShader(const ValueBlock& valueBlock)
{
	ostringstream shader;
	const bool	usesInout		 = usesShaderInoutQualifiers(m_targetVersion);
	const bool	customColorOut = usesInout;
	const char*   fragIn		 = usesInout ? "in" : "varying";

	shader << glu::getGLSLVersionDeclaration(m_targetVersion) << "\n";

	shader << "precision mediump float;\n";
	shader << "precision mediump int;\n";
	shader << "\n";

	if (customColorOut)
	{
		shader << "layout(location = 0) out mediump vec4 dEQP_FragColor;\n";
		shader << "\n";
	}

	genCompareFunctions(shader, valueBlock, true);
	shader << "\n";

	// Declarations (varying, reference for each output).
	for (int ndx = 0; ndx < (int)valueBlock.values.size(); ndx++)
	{
		const ShaderCase::Value& val		  = valueBlock.values[ndx];
		DataType				 floatType	= getDataTypeFloatScalars(val.dataType);
		const char*				 floatTypeStr = getDataTypeName(floatType);
		const char*				 refTypeStr   = getDataTypeName(val.dataType);

		if (val.storageType == ShaderCase::Value::STORAGE_OUTPUT)
		{
			if (getDataTypeScalarType(val.dataType) == TYPE_FLOAT)
				shader << fragIn << " " << floatTypeStr << " " << val.valueName << ";\n";
			else
				shader << fragIn << " " << floatTypeStr << " v_" << val.valueName << ";\n";

			shader << "uniform " << refTypeStr << " ref_" << val.valueName << ";\n";
		}
	}

	shader << "\n";
	shader << "void main()\n";
	shader << "{\n";

	shader << " ";
	genCompareOp(shader, customColorOut ? "dEQP_FragColor" : "gl_FragColor", valueBlock, "v_", DE_NULL);

	shader << "}\n";
	return shader.str();
}